

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# allocator_unittests.cc
# Opt level: O1

void __thiscall
LibcAllocatorWithRealloc_TestSTL_Test::~LibcAllocatorWithRealloc_TestSTL_Test
          (LibcAllocatorWithRealloc_TestSTL_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this);
  return;
}

Assistant:

TEST(LibcAllocatorWithRealloc, TestSTL) {
  // Test strings copied from base/arena_unittest.cc
  static const char* test_strings[] = {
      "aback",        "abaft",        "abandon",       "abandoned",
      "abandoning",   "abandonment",  "abandons",      "abase",
      "abased",       "abasement",    "abasements",    "abases",
      "abash",        "abashed",      "abashes",       "abashing",
      "abasing",      "abate",        "abated",        "abatement",
      "abatements",   "abater",       "abates",        "abating",
      "abbe",         "abbey",        "abbeys",        "abbot",
      "abbots",       "abbreviate",   "abbreviated",   "abbreviates",
      "abbreviating", "abbreviation", "abbreviations", "abdomen",
      "abdomens",     "abdominal",    "abduct",        "abducted",
      "abduction",    "abductions",   "abductor",      "abductors",
      "abducts",      "Abe",          "abed",          "Abel",
      "Abelian",      "Abelson",      "Aberdeen",      "Abernathy",
      "aberrant",     "aberration",   "aberrations",   "abet",
      "abets",        "abetted",      "abetter",       "abetting",
      "abeyance",     "abhor",        "abhorred",      "abhorrent",
      "abhorrer",     "abhorring",    "abhors",        "abide",
      "abided",       "abides",       "abiding"};
  cstring_vector v;
  for (size_t i = 0; i < arraysize(test_strings); ++i) {
    v.push_back(test_strings[i]);
  }
  for (size_t i = arraysize(test_strings); i > 0; --i) {
    ASSERT_EQ(cstring(test_strings[i - 1]), v.back());
    v.pop_back();
  }
}